

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

MockSpec<void_(char_*,_unsigned_long)> * __thiscall
testing::internal::FunctionMocker<void_(char_*,_unsigned_long)>::With
          (FunctionMocker<void_(char_*,_unsigned_long)> *this,Matcher<char_*> *m1,
          Matcher<unsigned_long> *m2)

{
  tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
  local_40;
  
  std::tr1::
  tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
  ::tuple(&local_40,m1,m2);
  std::tr1::
  tuple<testing::Matcher<char*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>
  ::CopyFrom<testing::Matcher<char*>,testing::Matcher<unsigned_long>>
            ((tuple<testing::Matcher<char*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>
              *)&(this->super_FunctionMockerBase<void_(char_*,_unsigned_long)>).current_spec_.
                 matchers_,&local_40);
  std::tr1::
  tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
  ::~tuple(&local_40);
  return &(this->super_FunctionMockerBase<void_(char_*,_unsigned_long)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1, m2));
    return this->current_spec();
  }